

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbwindow.cpp
# Opt level: O1

void __thiscall QFbWindow::setGeometry(QFbWindow *this,QRect *rect)

{
  QWindow *pQVar1;
  long in_FS_OFFSET;
  QRect QVar2;
  undefined1 auVar3 [16];
  QRect local_30;
  QRegion local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = (QRect)(**(code **)(*(long *)this + 0x30))();
  this->mOldGeometry = QVar2;
  pQVar1 = (QWindow *)QPlatformWindow::window();
  QWindowSystemInterface::handleGeometryChange<QWindowSystemInterface::DefaultDelivery>(pQVar1,rect)
  ;
  QPlatformWindow::setGeometry((QRect *)this);
  if (((((this->mOldGeometry).x1.m_i != (rect->x1).m_i) ||
       ((this->mOldGeometry).x2.m_i != (rect->x2).m_i)) ||
      ((this->mOldGeometry).y1.m_i != (rect->y1).m_i)) ||
     ((this->mOldGeometry).y2.m_i != (rect->y2).m_i)) {
    pQVar1 = (QWindow *)QPlatformWindow::window();
    auVar3 = (**(code **)(*(long *)this + 0x30))(this);
    local_30.x2.m_i = auVar3._8_4_ - auVar3._0_4_;
    local_30.x1.m_i = 0;
    local_30.y1.m_i = 0;
    local_30.y2.m_i = auVar3._12_4_ - auVar3._4_4_;
    QRegion::QRegion(&local_20,&local_30,Rectangle);
    QWindowSystemInterface::handleExposeEvent<QWindowSystemInterface::DefaultDelivery>
              (pQVar1,&local_20);
    QRegion::~QRegion(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbWindow::setGeometry(const QRect &rect)
{
    // store previous geometry for screen update
    mOldGeometry = geometry();

    QWindowSystemInterface::handleGeometryChange(window(), rect);

    QPlatformWindow::setGeometry(rect);

    if (mOldGeometry != rect)
        QWindowSystemInterface::handleExposeEvent(window(), QRect(QPoint(0, 0), geometry().size()));
}